

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void anon_unknown.dwarf_775ed::parse_config_file(string *config_filename,string *program_name)

{
  string *psVar1;
  char cVar2;
  int iVar3;
  Node *pNVar4;
  istream *piVar5;
  long lVar6;
  iterator iVar7;
  ostream *poVar8;
  _Alloc_hider _Var9;
  string argval;
  string section;
  string argname;
  string line;
  ifstream in;
  string local_2d8;
  string local_2b8;
  undefined1 *local_298;
  size_t local_290;
  undefined1 local_288 [16];
  string local_278;
  char *local_258;
  ulong local_250;
  char local_248 [16];
  long local_238 [65];
  
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"*","");
  pNVar4 = GEO::SmartPointer<GEO::FileSystem::Node>::operator->
                     ((SmartPointer<GEO::FileSystem::Node> *)&(anonymous_namespace)::root_);
  iVar3 = (*(pNVar4->super_Counted)._vptr_Counted[2])(pNVar4,config_filename);
  if ((char)iVar3 != '\0') {
    std::ifstream::ifstream((istream *)local_238,(config_filename->_M_dataplus)._M_p,_S_in);
    local_258 = local_248;
    local_250 = 0;
    local_248[0] = '\0';
LAB_0012e922:
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_258,cVar2);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      if (((local_250 < 3) || (*local_258 != '[')) || (local_258[local_250 - 1] != ']')) {
        if (local_290 != program_name->_M_string_length) goto LAB_0012e9ed;
        if (local_290 != 0) {
          iVar3 = bcmp(local_298,(program_name->_M_dataplus)._M_p,local_290);
          if (iVar3 != 0) goto LAB_0012e9ed;
        }
        goto LAB_0012ea06;
      }
      std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_258);
      GEO::String::to_uppercase(&local_278,&local_2b8);
      std::__cxx11::string::operator=((string *)&local_298,(string *)&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      psVar1 = &local_2b8;
      _Var9._M_p = local_2b8._M_dataplus._M_p;
      goto LAB_0012ebad;
    }
    (anonymous_namespace)::loaded_config_file = 1;
    if (local_258 != local_248) {
      operator_delete(local_258);
    }
    std::ifstream::~ifstream(local_238);
  }
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  return;
LAB_0012e9ed:
  iVar3 = std::__cxx11::string::compare((char *)&local_298);
  if (iVar3 == 0) {
LAB_0012ea06:
    lVar6 = std::__cxx11::string::find((char *)&local_258,0x190647,0);
    if (lVar6 != -1) {
      std::__cxx11::string::substr((ulong)&local_278,(ulong)&local_258);
      std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_258);
      iVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
              ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                      *)((anonymous_namespace)::desc_ + 0x20),&local_278);
      if ((iVar7._M_node == (_Base_ptr)((anonymous_namespace)::desc_ + 0x28)) ||
         (iVar7._M_node[4]._M_color == _S_red)) {
        if ((anonymous_namespace)::auto_create_args == '\x01') {
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"...","");
          GEO::CmdLine::declare_arg(&local_278,ARG_STRING,&local_2b8,&local_2d8,ARG_FLAGS_DEFAULT);
        }
        else {
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"config","");
          poVar8 = GEO::Logger::warn(&local_2d8);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_278._M_dataplus._M_p,local_278._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"=",1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," ignored",8);
          std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
      }
      else {
        GEO::CmdLine::set_arg(&local_278,&local_2b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      psVar1 = &local_278;
      _Var9._M_p = local_278._M_dataplus._M_p;
LAB_0012ebad:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var9._M_p != &psVar1->field_2) {
        operator_delete(_Var9._M_p);
      }
    }
  }
  goto LAB_0012e922;
}

Assistant:

void parse_config_file(
	const std::string& config_filename, const std::string& program_name
    ) {
	std::string section = "*";
	if(FileSystem::is_file(config_filename)) {
	    std::ifstream in(config_filename.c_str());
	    std::string line;
	    while(std::getline(in,line)) {
		if(line.length() >= 3 && line[0] == '[' && line[line.length()-1] == ']') {
		    section = String::to_uppercase(line.substr(1,line.length()-2));
		} else if(section == program_name || section == "*") {
		    size_t pos = line.find("=");
		    if(pos != std::string::npos) {
			std::string argname = line.substr(0,pos);
			std::string argval  = line.substr(pos+1,line.length()-pos-1);
			if(CmdLine::arg_is_declared(argname)) {
			    CmdLine::set_arg(argname, argval);
			} else {
			    if(auto_create_args) {
				CmdLine::declare_arg(argname, argval, "...");
			    } else {
				Logger::warn("config") << argname
						       << "=" << argval
						       << " ignored"
						       << std::endl;
			    }
			}
		    }
		}
	    }
	    loaded_config_file= true;
	}
    }